

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

void comp_func_solid_Source_rgbafp_avx2
               (QRgbaFloat32 *dst,int length,QRgbaFloat32 color,uint const_alpha)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [24];
  undefined8 *puVar8;
  undefined1 (*pauVar9) [24];
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  __m128 dstVector_1;
  __m256 dstVector;
  int x;
  __m256 minusAlphaVector256;
  __m256 colorVector256;
  __m128 colorVector;
  __m128 minusAlphaVector;
  __m128 alphaVector;
  float a;
  int i;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined8 uStack_310;
  undefined8 uStack_308;
  int local_2e4;
  int local_254;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM1._0_16_);
  if (in_EDX == 0xff) {
    for (local_254 = 0; local_254 < in_ESI; local_254 = local_254 + 1) {
      puVar8 = (undefined8 *)(in_RDI + (long)local_254 * 0x10);
      *puVar8 = uVar1;
      puVar8[1] = uVar2;
    }
  }
  else {
    fVar10 = (float)in_EDX / 255.0;
    vpcmpeqd_avx(SUB6416(ZEXT464(0x437f0000),0),SUB6416(ZEXT464(0x437f0000),0));
    fVar6 = 1.0 - fVar10;
    local_100 = (float)uVar1;
    fStack_fc = (float)((ulong)uVar1 >> 0x20);
    fStack_f8 = (float)uVar2;
    fStack_f4 = (float)((ulong)uVar2 >> 0x20);
    local_100 = local_100 * fVar10;
    fStack_fc = fStack_fc * fVar10;
    fStack_f8 = fStack_f8 * fVar10;
    fStack_f4 = fStack_f4 * fVar10;
    auVar11 = ZEXT1632(CONCAT412(fStack_f4,CONCAT48(fStack_f8,CONCAT44(fStack_fc,local_100))));
    vpcmpeqd_avx2(auVar11,auVar11);
    fVar10 = 1.0 - fVar10;
    auVar4 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar10),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar10),0x30);
    auVar5 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar10),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar10),0x30);
    auVar11._16_16_ = auVar4;
    auVar11._0_16_ = auVar5;
    for (local_2e4 = 0; local_2e4 < in_ESI + -1; local_2e4 = local_2e4 + 2) {
      vpcmpeqd_avx2(auVar11,auVar11);
      pauVar9 = (undefined1 (*) [24])(in_RDI + (long)local_2e4 * 0x10);
      auVar7 = *pauVar9;
      uVar1 = *(undefined8 *)pauVar9[1];
      local_1e0 = auVar7._0_4_;
      fStack_1dc = auVar7._4_4_;
      fStack_1d8 = auVar7._8_4_;
      fStack_1d4 = auVar7._12_4_;
      fStack_1d0 = auVar7._16_4_;
      fStack_1cc = auVar7._20_4_;
      fStack_1c8 = (float)uVar1;
      fStack_1c4 = (float)((ulong)uVar1 >> 0x20);
      local_200 = auVar5._0_4_;
      fStack_1fc = auVar5._4_4_;
      fStack_1f8 = auVar5._8_4_;
      fStack_1f4 = auVar5._12_4_;
      fStack_1f0 = auVar4._0_4_;
      fStack_1ec = auVar4._4_4_;
      fStack_1e8 = auVar4._8_4_;
      local_320._4_4_ = fStack_1dc * fStack_1fc + fStack_fc;
      local_320._0_4_ = local_1e0 * local_200 + local_100;
      fStack_318 = fStack_1d8 * fStack_1f8 + fStack_f8;
      fStack_314 = fStack_1d4 * fStack_1f4 + fStack_f4;
      uStack_310._0_4_ = fStack_1d0 * fStack_1f0 + local_100;
      uStack_310._4_4_ = fStack_1cc * fStack_1ec + fStack_fc;
      uStack_308._0_4_ = fStack_1c8 * fStack_1e8 + fStack_f8;
      uStack_308._4_4_ = fStack_1c4 + fStack_f4;
      auVar11 = _local_320;
      uStack_308 = auVar11._24_8_;
      auVar11._16_8_ = uStack_310;
      auVar11._0_16_ = _local_320;
      auVar11._24_8_ = uStack_308;
      *(undefined1 (*) [32])(in_RDI + (long)local_2e4 * 0x10) = auVar11;
    }
    if (local_2e4 < in_ESI) {
      vpcmpeqd_avx(auVar11._0_16_,auVar11._0_16_);
      puVar8 = (undefined8 *)(in_RDI + (long)local_2e4 * 0x10);
      uVar1 = *puVar8;
      uVar2 = puVar8[1];
      local_120 = (float)uVar1;
      fStack_11c = (float)((ulong)uVar1 >> 0x20);
      fStack_118 = (float)uVar2;
      fStack_114 = (float)((ulong)uVar2 >> 0x20);
      local_330 = CONCAT44(fStack_11c * fVar6 + fStack_fc,local_120 * fVar6 + local_100);
      uStack_328._0_4_ = fStack_118 * fVar6 + fStack_f8;
      uStack_328._4_4_ = fStack_114 * fVar6 + fStack_f4;
      puVar8 = (undefined8 *)(in_RDI + (long)local_2e4 * 0x10);
      *puVar8 = local_330;
      puVar8[1] = uStack_328;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QT_FASTCALL comp_func_solid_Source_rgbafp_avx2(QRgbaFloat32 *dst, int length, QRgbaFloat32 color, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        for (int i = 0; i < length; ++i)
            dst[i] = color;
    } else {
        const float a = const_alpha / 255.0f;
        const __m128 alphaVector = _mm_set1_ps(a);
        const __m128 minusAlphaVector = _mm_set1_ps(1.0f - a);
        __m128 colorVector = _mm_loadu_ps((const float *)&color);
        colorVector = _mm_mul_ps(colorVector, alphaVector);
        const __m256 colorVector256 = _mm256_insertf128_ps(_mm256_castps128_ps256(colorVector), colorVector, 1);
        const __m256 minusAlphaVector256 = _mm256_set1_ps(1.0f - a);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            dstVector = _mm256_mul_ps(dstVector, minusAlphaVector256);
            dstVector = _mm256_add_ps(dstVector, colorVector256);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            dstVector = _mm_mul_ps(dstVector, minusAlphaVector);
            dstVector = _mm_add_ps(dstVector, colorVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}